

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

pair<int,_int> __thiscall
Lodtalk::InstanceVariableScope::findInstanceVariable
          (InstanceVariableScope *this,ClassDescription *pos,Oop symbol)

{
  ClassDescription *pos_00;
  pair<int,_int> pVar1;
  ulong uVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var4;
  ulong *puVar5;
  uint uVar6;
  pair<int,_int> pVar7;
  ulong *puVar8;
  uint uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>,_bool>
  pVar10;
  pair<Lodtalk::Oop,_std::shared_ptr<Lodtalk::TemporalVariableLookup>_> pStack_60;
  anon_union_8_4_0eb573b0_for_Oop_0 aStack_48;
  
  pos_00 = (ClassDescription *)(pos->super_Behavior).superclass;
  if (pos_00 == (ClassDescription *)&NilObject) {
    pp_Var4 = (_func_int **)0x0;
  }
  else {
    pVar1 = findInstanceVariable(this,pos_00,symbol);
    pp_Var4 = (_func_int **)((ulong)pVar1 >> 0x20);
    if (-1 < pVar1.first) goto LAB_0013657f;
  }
  pVar1.first = -1;
  pVar1.second = 0;
  puVar5 = (ulong *)(pos->instanceVariables).field_0.pointer;
  if (puVar5 != &NilObject) {
    uVar3 = *puVar5;
    uVar2 = uVar3 & 0xff;
    if (uVar2 == 0xff) {
      uVar2 = puVar5[-1];
    }
    pVar7 = (pair<int,_int>)(uVar3 >> 0x23);
    uVar6 = (uint)(uVar3 >> 0x23);
    uVar9 = uVar6 & 0x1f;
    if (uVar9 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar2;
      if (8 < uVar9) {
        if (uVar9 < 0x10) {
          findInstanceVariable();
          aStack_48 = symbol.field_0;
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
          this_00->_M_use_count = 1;
          this_00->_M_weak_count = 1;
          this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164cb0;
          this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__VariableLookup_00164d00;
          this_00[1]._M_use_count = -1;
          this_00[1]._M_weak_count = -1;
          this_00[2]._vptr__Sp_counted_base = pp_Var4;
          *(undefined2 *)&this_00[2]._M_use_count = 0;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = 2;
          }
          pStack_60.second.
          super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(this_00 + 1);
          pStack_60.second.
          super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = this_00;
          pVar10 = std::
                   _Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
                   ::
                   _M_emplace_unique<std::pair<Lodtalk::Oop,std::shared_ptr<Lodtalk::TemporalVariableLookup>>>
                             ((_Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
                               *)(puVar5 + 3),&pStack_60);
          if (pStack_60.second.
              super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (pStack_60.second.
                       super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            *(long *)pVar7 = 0;
            *(long *)((long)pVar7 + 8) = 0;
          }
          else {
            *(element_type **)pVar7 = (element_type *)(this_00 + 1);
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pVar7 + 8) = this_00;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          return pVar7;
        }
        uVar3 = ((ulong)(uVar6 & 7) - 8) + uVar2 * 8;
        if (((ulong)pVar7 & 7) == 0) {
          uVar3 = uVar2 * 8;
        }
      }
    }
    puVar8 = (ulong *)0x0;
    if (((ulong)puVar5 & 7) == 0) {
      puVar8 = puVar5 + 1;
    }
    if (uVar3 != 0) {
      uVar2 = 0;
      do {
        if ((anon_union_8_4_0eb573b0_for_Oop_0)
            ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar8 + uVar2))->pointer == symbol.field_0) {
          pVar1.first = (int)uVar2 + (int)pp_Var4;
          pVar1.second = 0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    pp_Var4 = (_func_int **)(ulong)(uint)((int)pp_Var4 + (int)uVar3);
  }
LAB_0013657f:
  return (pair<int,_int>)((ulong)pVar1 & 0xffffffff | (long)pp_Var4 << 0x20);
}

Assistant:

std::pair<int, int> InstanceVariableScope::findInstanceVariable(ClassDescription *pos, Oop symbol)
{
	// Find the superclass first
	auto instanceCount = 0;
	auto super = pos->superclass;
	if(!isNil(super))
	{
		auto superInstance = findInstanceVariable(reinterpret_cast<ClassDescription*> (super), symbol);
		if(superInstance.first >= 0)
			return superInstance;
		instanceCount = superInstance.second;
	}

	// Find the symbol here
	auto instanceVarNames = pos->instanceVariables;
	auto instanceVarIndex = -1;
	if(!instanceVarNames.isNil())
	{
		size_t count = instanceVarNames.getNumberOfElements();
		auto nameArray = reinterpret_cast<Oop*> (instanceVarNames.getFirstFieldPointer());
		for(size_t i = 0; i < count; ++i)
		{
			if(nameArray[i] == symbol)
			{
				instanceVarIndex = (int)i + instanceCount;
				break;
			}
		}
		instanceCount += (int)count;
	}

	return std::make_pair(instanceVarIndex, instanceCount);
}